

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O1

void * __thiscall LockedPool::alloc(LockedPool *this,size_t size)

{
  mutex *__mutex;
  list<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_> *plVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  void *pvVar5;
  undefined8 uVar6;
  _List_node_base *p_Var7;
  void *unaff_R12;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  __mutex = &this->mutex;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 != 0) {
    if ((*(long *)(in_FS_OFFSET + 0x28) == lVar2) &&
       (uVar6 = std::__throw_system_error(iVar4), *(long *)(in_FS_OFFSET + 0x28) == lVar2)) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar6);
    }
    goto LAB_0041535c;
  }
  if (size - 0x40001 < 0xfffffffffffc0000) {
LAB_00415299:
    pvVar5 = (void *)0x0;
  }
  else {
    plVar1 = &this->arenas;
    p_Var7 = (_List_node_base *)plVar1;
    do {
      p_Var7 = (((_List_base<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>
                  *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      pvVar5 = unaff_R12;
      if (p_Var7 == (_List_node_base *)plVar1) break;
      pvVar5 = Arena::alloc((Arena *)(p_Var7 + 1),size);
    } while (pvVar5 == (void *)0x0);
    if (p_Var7 == (_List_node_base *)plVar1) {
      bVar3 = new_arena(this,0x40000,0x10);
      if (!bVar3) goto LAB_00415299;
      pvVar5 = Arena::alloc((Arena *)((this->arenas).
                                      super__List_base<LockedPool::LockedPageArena,_std::allocator<LockedPool::LockedPageArena>_>
                                      ._M_impl._M_node.super__List_node_base._M_prev + 1),size);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return pvVar5;
  }
LAB_0041535c:
  __stack_chk_fail();
}

Assistant:

void* LockedPool::alloc(size_t size)
{
    std::lock_guard<std::mutex> lock(mutex);

    // Don't handle impossible sizes
    if (size == 0 || size > ARENA_SIZE)
        return nullptr;

    // Try allocating from each current arena
    for (auto &arena: arenas) {
        void *addr = arena.alloc(size);
        if (addr) {
            return addr;
        }
    }
    // If that fails, create a new one
    if (new_arena(ARENA_SIZE, ARENA_ALIGN)) {
        return arenas.back().alloc(size);
    }
    return nullptr;
}